

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

void __thiscall
CLOptions::AddVersionInfo
          (CLOptions *this,string *text_to_be_printed,string *param_name,string *param_descrip)

{
  pointer pcVar1;
  string version_opt_desc;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_68[0] = local_58;
  if (param_name->_M_string_length == 0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"version","");
  }
  else {
    pcVar1 = (param_name->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + param_name->_M_string_length);
  }
  std::__cxx11::string::_M_assign((string *)&this->version_str);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  if (param_descrip->_M_string_length == 0) {
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_68,"Print version information and exit.","");
  }
  else {
    pcVar1 = (param_descrip->_M_dataplus)._M_p;
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,pcVar1,pcVar1 + param_descrip->_M_string_length);
  }
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->version_opt).
              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .parameter_name);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->version_opt).
              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .description);
  pcVar1 = (text_to_be_printed->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + text_to_be_printed->_M_string_length);
  std::__cxx11::string::_M_assign
            ((string *)
             &(this->version_opt).
              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .value);
  (this->version_opt).
  super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>.
  is_set = true;
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  return;
}

Assistant:

void AddVersionInfo(const std::string& text_to_be_printed = "version text not set",
                        const std::string& param_name = "",
                        const std::string& param_descrip = "")
    {
        // Set the name of the parameter
        version_str = (param_name.size() > 0) ? param_name : "version" ;
        std::string version_opt_desc = (param_descrip.empty()) ? "Print version information and exit." : param_descrip ;
        
        // Set the actual parameter
        version_opt.setParamName(version_str) ;
        version_opt.setDescription(version_opt_desc) ;
        version_opt.setValue(text_to_be_printed) ;
    }